

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
slang::CommandLine::add
          (CommandLine *this,string_view name,OptionCallback *cb,string_view desc,
          string_view valueName,bool isFileName)

{
  string_view desc_00;
  string_view name_00;
  variant<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_80;
  char *local_58;
  char *pcStack_50;
  byte local_39;
  OptionCallback *pOStack_38;
  bool isFileName_local;
  OptionCallback *cb_local;
  CommandLine *this_local;
  string_view desc_local;
  string_view name_local;
  
  pcStack_50 = name._M_str;
  local_58 = (char *)name._M_len;
  desc_local._M_len = (size_t)desc._M_str;
  this_local = (CommandLine *)desc._M_len;
  local_39 = isFileName;
  pOStack_38 = cb;
  cb_local = (OptionCallback *)this;
  desc_local._M_str = local_58;
  std::
  variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>
  ::
  variant<std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>&,void,void,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>,void>
            ((variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>
              *)&local_80,cb);
  name_00._M_str = pcStack_50;
  name_00._M_len = (size_t)local_58;
  desc_00._M_str = (char *)desc_local._M_len;
  desc_00._M_len = (size_t)this_local;
  addInternal(this,name_00,(OptionStorage *)&local_80,desc_00,valueName,(bool)(local_39 & 1));
  std::
  variant<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::~variant(&local_80);
  return;
}

Assistant:

void CommandLine::add(string_view name, OptionCallback cb, string_view desc, string_view valueName,
                      bool isFileName) {
    addInternal(name, cb, desc, valueName, isFileName);
}